

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3423::SetupInitial(ChElementShellANCF_3423 *this,ChSystem *system)

{
  ulong uVar1;
  size_t i;
  pointer pLVar2;
  size_t kl_1;
  long lVar3;
  long lVar4;
  size_t kl;
  ulong uVar5;
  double local_40;
  undefined1 *local_38;
  
  pLVar2 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = 0;
  uVar1 = ((long)(this->m_layers).
                 super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar2) / 0x160;
  this->m_numLayers = uVar1;
  this->m_thickness = 0.0;
  for (uVar5 = 0; uVar5 < uVar1; uVar5 = uVar5 + 1) {
    Layer::SetupInitial((Layer *)((long)&(pLVar2->m_T0).
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                         .m_storage + lVar4 + -0x40));
    pLVar2 = (this->m_layers).
             super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar1 = this->m_numLayers;
    lVar3 = lVar4 + -0x28;
    lVar4 = lVar4 + 0x160;
    this->m_thickness =
         *(double *)
          ((long)&(pLVar2->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                  m_storage + lVar3) + this->m_thickness;
  }
  local_38 = &DAT_bff0000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&this->m_GaussZ,(double *)&local_38);
  local_40 = 0.0;
  lVar4 = 0x18;
  for (uVar1 = 0; uVar1 < this->m_numLayers; uVar1 = uVar1 + 1) {
    local_40 = local_40 +
               *(double *)
                ((long)&(((this->m_layers).
                          super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_T0).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage +
                lVar4 + -0x40);
    local_38 = (undefined1 *)((local_40 + local_40) / this->m_thickness + -1.0);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->m_GaussZ,(double *)&local_38);
    lVar4 = lVar4 + 0x160;
  }
  std::
  vector<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_std::allocator<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
  ::resize(&this->m_alphaEAS,this->m_numLayers);
  std::
  vector<Eigen::Matrix<double,_5,_5,_1,_5,_5>,_std::allocator<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>_>
  ::resize(&this->m_KalphaEAS,this->m_numLayers);
  lVar4 = 0;
  lVar3 = 0;
  for (uVar1 = 0; uVar1 < this->m_numLayers; uVar1 = uVar1 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)
               ((long)&(((this->m_alphaEAS).
                         super__Vector_base<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_std::allocator<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.
                       m_data + lVar4));
    Eigen::DenseBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_> *)
               ((long)&(((this->m_KalphaEAS).
                         super__Vector_base<Eigen::Matrix<double,_5,_5,_1,_5,_5>,_std::allocator<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>).m_storage.
                       m_data + lVar3));
    lVar3 = lVar3 + 200;
    lVar4 = lVar4 + 0x28;
  }
  this->m_GaussScaling = this->m_lenX * this->m_lenY * this->m_thickness * 0.125;
  ComputeMassMatrix(this);
  ComputeGravityForceScale(this);
  return;
}

Assistant:

void ChElementShellANCF_3423::SetupInitial(ChSystem* system) {
    // Perform layer initialization and accumulate element thickness.
    m_numLayers = m_layers.size();
    m_thickness = 0;
    for (size_t kl = 0; kl < m_numLayers; kl++) {
        m_layers[kl].SetupInitial();
        m_thickness += m_layers[kl].Get_thickness();
    }

    // Loop again over the layers and calculate the range for Gauss integration in the
    // z direction (values in [-1,1]).
    m_GaussZ.push_back(-1);
    double z = 0;
    for (size_t kl = 0; kl < m_numLayers; kl++) {
        z += m_layers[kl].Get_thickness();
        m_GaussZ.push_back(2 * z / m_thickness - 1);
    }

    // Reserve space for the EAS parameters and Jacobians.
    m_alphaEAS.resize(m_numLayers);
    m_KalphaEAS.resize(m_numLayers);
    for (size_t i = 0; i < m_numLayers; i++) {
        m_alphaEAS[i].setZero();
        m_KalphaEAS[i].setZero();
    }

    // Cache the scaling factor (due to change of integration intervals)
    m_GaussScaling = (m_lenX * m_lenY * m_thickness) / 8;

    // Compute mass matrix and gravitational force scaling term (constant)
    ComputeMassMatrix();
    ComputeGravityForceScale();
}